

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O1

void __thiscall cfgfile::generator::cfg::class_t::class_t(class_t *this)

{
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_tag_name)._M_dataplus._M_p = (pointer)&(this->m_tag_name).field_2;
  (this->m_tag_name)._M_string_length = 0;
  (this->m_tag_name).field_2._M_local_buf[0] = '\0';
  (this->m_base_name)._M_dataplus._M_p = (pointer)&(this->m_base_name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_base_name,c_no_value_tag_name_abi_cxx11_,
             DAT_0013f3e0 + c_no_value_tag_name_abi_cxx11_);
  (this->m_base_value_type)._M_dataplus._M_p = (pointer)&(this->m_base_value_type).field_2;
  (this->m_base_value_type)._M_string_length = 0;
  (this->m_base_value_type).field_2._M_local_buf[0] = '\0';
  (this->m_fields).
  super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fields).
  super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fields).
  super__Vector_base<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&this->m_line_number = 0xffffffff;
  *(undefined4 *)((long)&this->m_line_number + 4) = 0xffffffff;
  *(undefined4 *)&this->m_column_number = 0xffffffff;
  *(undefined4 *)((long)&this->m_column_number + 4) = 0xffffffff;
  this->m_index = 0;
  this->m_parent = (namespace_t *)0x0;
  return;
}

Assistant:

class_t::class_t()
	:	m_base_name( c_no_value_tag_name )
	,	m_line_number( -1 )
	,	m_column_number( -1 )
	,	m_index( 0 )
	,	m_parent( 0 )
{
}